

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void Cmd_slot(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint uVar2;
  char *__nptr;
  long lVar3;
  long lVar4;
  int slot;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    __nptr = FCommandLine::operator[](argv,1);
    iVar1 = atoi(__nptr);
    if (iVar1 < 10) {
      lVar3 = (long)consoleplayer;
      lVar4 = (long)consoleplayer;
      uVar2 = FIntCVar::operator_cast_to_int(&dmflags2);
      SendItemUse = (AInventory *)
                    FWeaponSlot::PickWeapon
                              ((FWeaponSlot *)(lVar3 * 0x2a0 + 0x1ae72a0 + (long)iVar1 * 0x10),
                               (player_t *)(&players + lVar4 * 0x54),
                               (bool)(((uVar2 & 0x1000000) != 0 ^ 0xffU) & 1));
    }
  }
  return;
}

Assistant:

CCMD (slot)
{
	if (argv.argc() > 1)
	{
		int slot = atoi (argv[1]);

		if (slot < NUM_WEAPON_SLOTS)
		{
			SendItemUse = players[consoleplayer].weapons.Slots[slot].PickWeapon (&players[consoleplayer], 
				!(dmflags2 & DF2_DONTCHECKAMMO));
		}
	}
}